

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::ClassDataType_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  size_type in_R9;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  UntypedFormatSpecImpl format;
  long local_28;
  code *local_20;
  
  FVar2 = GetOptimizeFor(*(FileDescriptor **)(this + 0x18),(Options *)descriptor,(bool *)0x0);
  if ((FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) &&
     (bVar1 = IsBootstrapProto((Options *)descriptor,*(FileDescriptor **)(this + 0x18)), !bVar1)) {
    local_28 = (ulong)*(ushort *)(*(long *)(this + 0x10) + 2) + 1;
    local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
    args.len_ = in_R9;
    args.ptr_ = (pointer)0x1;
    format.size_ = (size_t)&local_28;
    format.data_ = (void *)0x11;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (__return_storage_ptr__,(str_format_internal *)"ClassDataLite<%d>",format,args);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"ClassDataFull","");
  return __return_storage_ptr__;
}

Assistant:

std::string ClassDataType(const Descriptor* descriptor,
                          const Options& options) {
  return HasDescriptorMethods(descriptor->file(), options) ||
                 // Boostrap protos are always full, even when lite is forced
                 // via options.
                 IsBootstrapProto(options, descriptor->file())
             ? "ClassDataFull"
             : absl::StrFormat("ClassDataLite<%d>",
                               descriptor->full_name().size() + 1);
}